

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

container_t * container_add(container_t *c,uint16_t val,uint8_t typecode,uint8_t *new_typecode)

{
  int iVar1;
  undefined1 *in_RCX;
  char in_DL;
  uint16_t in_SI;
  bitset_container_t *bitset;
  array_container_t *ac;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  array_container_t *in_stack_ffffffffffffffd0;
  uint16_t value;
  run_container_t *in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  local_8 = (array_container_t *)
            get_writable_copy_if_shared
                      ((container_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (uint8_t *)0x16380b);
  if (in_DL == '\x01') {
    bitset_container_set((bitset_container_t *)local_8,in_SI);
    *in_RCX = 1;
  }
  else {
    value = (uint16_t)((ulong)in_stack_ffffffffffffffd0 >> 0x30);
    if (in_DL == '\x02') {
      iVar1 = array_container_try_add(local_8,value,(int32_t)in_stack_ffffffffffffffd0);
      if (iVar1 == -1) {
        local_8 = (array_container_t *)bitset_container_from_array(in_stack_ffffffffffffffd0);
        bitset_container_add((bitset_container_t *)local_8,in_SI);
        *in_RCX = 1;
      }
      else {
        *in_RCX = 2;
      }
    }
    else {
      run_container_add(in_stack_ffffffffffffffd8,value);
      *in_RCX = 3;
    }
  }
  return local_8;
}

Assistant:

static inline container_t *container_add(
    container_t *c, uint16_t val,
    uint8_t typecode,  // !!! should be second argument?
    uint8_t *new_typecode) {
    c = get_writable_copy_if_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            bitset_container_set(CAST_bitset(c), val);
            *new_typecode = BITSET_CONTAINER_TYPE;
            return c;
        case ARRAY_CONTAINER_TYPE: {
            array_container_t *ac = CAST_array(c);
            if (array_container_try_add(ac, val, DEFAULT_MAX_SIZE) != -1) {
                *new_typecode = ARRAY_CONTAINER_TYPE;
                return ac;
            } else {
                bitset_container_t *bitset = bitset_container_from_array(ac);
                bitset_container_add(bitset, val);
                *new_typecode = BITSET_CONTAINER_TYPE;
                return bitset;
            }
        } break;
        case RUN_CONTAINER_TYPE:
            // per Java, no container type adjustments are done (revisit?)
            run_container_add(CAST_run(c), val);
            *new_typecode = RUN_CONTAINER_TYPE;
            return c;
        default:
            assert(false);
            roaring_unreachable;
            return NULL;
    }
}